

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int luaD_poscall(lua_State *L,CallInfo *ci,StkId firstResult,int nres)

{
  short sVar1;
  ushort uVar2;
  StkId pTVar3;
  Value *pVVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  Value *pVVar8;
  uint uVar9;
  TValue *io2;
  TValue *pTVar10;
  
  if (L->magic != '*') {
    __assert_fail("L->magic == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x18a,"int luaD_poscall(lua_State *, CallInfo *, StkId, int)");
  }
  if (ci->magic != '*') {
    __assert_fail("ci->magic == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x18b,"int luaD_poscall(lua_State *, CallInfo *, StkId, int)");
  }
  sVar1 = ci->nresults;
  uVar9 = (uint)sVar1;
  pTVar10 = firstResult;
  if ((L->hookmask & 6) != 0) {
    if ((L->hookmask & 2) != 0) {
      pTVar3 = L->stack;
      luaD_hook(L,1,-1);
      firstResult = (StkId)(((long)firstResult - (long)pTVar3) + (long)L->stack);
    }
    L->oldpc = (ci->previous->u).l.savedpc;
    pTVar10 = firstResult;
  }
  pVVar4 = &ci->func->value_;
  L->ci = ci->previous;
  if (sVar1 != 0) {
    if (sVar1 == 1) {
      if (nres == 0) {
        pTVar10 = &luaO_nilobject_;
      }
      *pVVar4 = pTVar10->value_;
      uVar2 = pTVar10->tt_;
      *(ushort *)(pVVar4 + 1) = uVar2;
      if (((short)uVar2 < 0) &&
         (((uVar2 & 0x7f) != (ushort)pVVar4->gc->tt ||
          ((L != (lua_State *)0x0 && ((pVVar4->gc->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))
         ) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x165,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
      }
    }
    else {
      if (sVar1 == -1) {
        if (0 < nres) {
          lVar7 = 0;
          do {
            *(undefined8 *)((long)pVVar4 + lVar7) = *(undefined8 *)((long)&pTVar10->value_ + lVar7);
            uVar2 = *(ushort *)((long)&pTVar10->tt_ + lVar7);
            *(ushort *)((long)pVVar4 + lVar7 + 8) = uVar2;
            if (((short)uVar2 < 0) &&
               (((uVar2 & 0x7f) != (ushort)*(byte *)(*(long *)((long)pVVar4 + lVar7) + 8) ||
                ((L != (lua_State *)0x0 &&
                 ((*(byte *)(*(long *)((long)pVVar4 + lVar7) + 9) & (L->l_G->currentwhite ^ 0x18))
                  != 0)))))) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                            ,0x16b,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
            }
            lVar7 = lVar7 + 0x10;
          } while ((ulong)(uint)nres << 4 != lVar7);
        }
        iVar5 = 0;
        uVar9 = nres;
        goto LAB_0012b1ef;
      }
      if (nres < (int)uVar9) {
        if (nres < 1) {
          uVar6 = 0;
        }
        else {
          lVar7 = 0;
          uVar6 = 0;
          do {
            *(undefined8 *)((long)pVVar4 + lVar7) = *(undefined8 *)((long)&pTVar10->value_ + lVar7);
            uVar2 = *(ushort *)((long)&pTVar10->tt_ + lVar7);
            *(ushort *)((long)pVVar4 + lVar7 + 8) = uVar2;
            if (((short)uVar2 < 0) &&
               (((uVar2 & 0x7f) != (ushort)*(byte *)(*(long *)((long)pVVar4 + lVar7) + 8) ||
                ((L != (lua_State *)0x0 &&
                 ((*(byte *)(*(long *)((long)pVVar4 + lVar7) + 9) & (L->l_G->currentwhite ^ 0x18))
                  != 0)))))) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                            ,0x177,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
            }
            uVar6 = uVar6 + 1;
            lVar7 = lVar7 + 0x10;
          } while ((uint)nres != uVar6);
        }
        if ((int)uVar6 < (int)uVar9) {
          lVar7 = (ulong)uVar9 - (uVar6 & 0xffffffff);
          pVVar8 = pVVar4 + (uVar6 & 0xffffffff) * 2 + 1;
          do {
            *(undefined2 *)pVVar8 = 0;
            pVVar8 = pVVar8 + 2;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
      }
      else if (0 < sVar1) {
        lVar7 = 0;
        do {
          *(undefined8 *)((long)pVVar4 + lVar7) = *(undefined8 *)((long)&pTVar10->value_ + lVar7);
          uVar2 = *(ushort *)((long)&pTVar10->tt_ + lVar7);
          *(ushort *)((long)pVVar4 + lVar7 + 8) = uVar2;
          if (((short)uVar2 < 0) &&
             (((uVar2 & 0x7f) != (ushort)*(byte *)(*(long *)((long)pVVar4 + lVar7) + 8) ||
              ((L != (lua_State *)0x0 &&
               ((*(byte *)(*(long *)((long)pVVar4 + lVar7) + 9) & (L->l_G->currentwhite ^ 0x18)) !=
                0)))))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x173,"int moveresults(lua_State *, const TValue *, StkId, int, int)");
          }
          lVar7 = lVar7 + 0x10;
        } while ((ulong)uVar9 << 4 != lVar7);
      }
    }
  }
  iVar5 = 1;
LAB_0012b1ef:
  L->top = (StkId)(pVVar4 + (long)(int)uVar9 * 2);
  return iVar5;
}

Assistant:

int luaD_poscall (lua_State *L, CallInfo *ci, StkId firstResult, int nres) {
  StkId res;
  lua_assert(L->magic == 42);
  lua_assert(ci->magic == 42);
  int wanted = ci->nresults;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  L->ci = ci->previous;  /* back to caller */
  /* move results to proper place */
  return moveresults(L, firstResult, res, nres, wanted);
}